

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

int __thiscall
capnp::_::OrphanBuilder::copy(OrphanBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  WirePointer *pWVar1;
  word *pwVar2;
  WirePointer *srcTarget;
  long lVar3;
  SegmentAnd<capnp::word_*> SVar4;
  SegmentReader *in_stack_00000008;
  CapTableReader *in_stack_00000010;
  WirePointer *in_stack_00000018;
  int in_stack_00000020;
  
  this->capTable = (CapTableBuilder *)0x0;
  this->location = (word *)0x0;
  (this->tag).content = 0;
  this->segment = (SegmentBuilder *)0x0;
  pWVar1 = in_stack_00000018 + 1;
  lVar3 = (long)((int)(in_stack_00000018->offsetAndKind).value >> 2);
  if (in_stack_00000008 == (SegmentReader *)0x0) {
    srcTarget = pWVar1 + lVar3;
  }
  else {
    pwVar2 = (in_stack_00000008->ptr).ptr;
    srcTarget = (WirePointer *)(pwVar2 + (in_stack_00000008->ptr).size_);
    if (((long)pwVar2 - (long)pWVar1 >> 3 <= lVar3) &&
       (lVar3 <= (long)srcTarget - (long)pWVar1 >> 3)) {
      srcTarget = pWVar1 + lVar3;
    }
  }
  SVar4 = WireHelpers::copyPointer
                    ((SegmentBuilder *)0x0,(CapTableBuilder *)src,(WirePointer *)this,
                     in_stack_00000008,in_stack_00000010,in_stack_00000018,(word *)srcTarget,
                     in_stack_00000020,(BuilderArena *)dst,false);
  this->segment = SVar4.segment;
  this->capTable = (CapTableBuilder *)src;
  this->location = SVar4.value;
  return (int)this;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, PointerReader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::copyPointer(
      nullptr, capTable, result.tagAsPtr(),
      copyFrom.segment, copyFrom.capTable, copyFrom.pointer, copyFrom.nestingLimit, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value);
  return result;
}